

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply.hpp
# Opt level: O2

uhugeint_t
duckdb::DecimalMultiplyOverflowCheck::
Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
          (uhugeint_t left,uhugeint_t right)

{
  bool bVar1;
  OutOfRangeException *this;
  allocator local_61;
  uhugeint_t result;
  string local_50;
  
  bVar1 = TryDecimalMultiply::Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                    (left,right,&result);
  if (bVar1) {
    return result;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,
             "Overflow in multiplication of DECIMAL(18) (%d * %d). You might want to add an explicit cast to a bigger decimal."
             ,&local_61);
  OutOfRangeException::OutOfRangeException<duckdb::uhugeint_t,duckdb::uhugeint_t>
            (this,&local_50,left,right);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryDecimalMultiply::Operation<TA, TB, TR>(left, right, result)) {
			throw OutOfRangeException("Overflow in multiplication of DECIMAL(18) (%d * %d). You might want to add an "
			                          "explicit cast to a bigger decimal.",
			                          left, right);
		}
		return result;
	}